

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
           *this)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_41;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_40;
  Type_Info local_28;
  
  local_28.m_type_info = (type_info *)&std::shared_ptr<unsigned_short>::typeinfo;
  local_28.m_bare_type_info = (type_info *)&unsigned_short::typeinfo;
  local_28.m_flags = 0x10;
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_40,__l,&local_41);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base((Proxy_Function_Impl_Base *)this,&local_40);
  if (local_40.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  *(undefined ***)this = &PTR__Proxy_Function_Base_003179a8;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }